

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Promise<void> __thiscall
kj::Promise<void>::attach<kj::String>(Promise<void> *this,String *attachments)

{
  char *pcVar1;
  size_t sVar2;
  PromiseNode *pPVar3;
  long *in_RDX;
  String local_38;
  PromiseNode *local_20;
  
  local_38.content.ptr = (char *)*in_RDX;
  local_38.content.size_ = in_RDX[1];
  local_38.content.disposer = (ArrayDisposer *)in_RDX[2];
  *in_RDX = 0;
  in_RDX[1] = 0;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::String>,kj::_::PromiseDisposer,kj::String>
            ((PromiseDisposer *)&local_20,(OwnPromiseNode *)attachments,&local_38);
  pPVar3 = local_20;
  sVar2 = local_38.content.size_;
  pcVar1 = local_38.content.ptr;
  local_20 = (PromiseNode *)0x0;
  (this->super_PromiseBase).node.ptr = pPVar3;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false,
      _::PromiseDisposer::appendPromise<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
          kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}